

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameCataloger.cpp
# Opt level: O0

void __thiscall psy::C::NameCataloger::NameCataloger(NameCataloger *this,SyntaxTree *tree)

{
  NameCatalog *this_00;
  SyntaxTree *tree_local;
  NameCataloger *this_local;
  
  SyntaxVisitor::SyntaxVisitor(&this->super_SyntaxVisitor,tree);
  (this->super_SyntaxVisitor)._vptr_SyntaxVisitor = (_func_int **)&PTR__NameCataloger_00732a38;
  this_00 = (NameCatalog *)operator_new(0x88);
  NameCatalog::NameCatalog(this_00);
  std::unique_ptr<psy::C::NameCatalog,std::default_delete<psy::C::NameCatalog>>::
  unique_ptr<std::default_delete<psy::C::NameCatalog>,void>
            ((unique_ptr<psy::C::NameCatalog,std::default_delete<psy::C::NameCatalog>> *)
             &this->catalog_,this_00);
  this->withinTypedef_ = false;
  return;
}

Assistant:

NameCataloger::NameCataloger(SyntaxTree* tree)
    : SyntaxVisitor(tree)
    , catalog_(new NameCatalog)
    , withinTypedef_(false)
{}